

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition.hxx
# Opt level: O2

void __thiscall
andres::Partition<unsigned_long>::representativeLabeling
          (Partition<unsigned_long> *this,
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *out)

{
  mapped_type *pmVar1;
  Index j;
  ulong uVar2;
  long lVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> r;
  allocator_type local_39;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::clear(&out->_M_t);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38,this->numberOfSets_,
             &local_39);
  representatives<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (this,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   )local_38._M_impl.super__Vector_impl_data._M_start);
  lVar3 = 0;
  for (uVar2 = 0; uVar2 < this->numberOfSets_; uVar2 = uVar2 + 1) {
    pmVar1 = std::
             map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::operator[](out,(key_type *)
                              ((long)local_38._M_impl.super__Vector_impl_data._M_start + lVar3));
    *pmVar1 = uVar2;
    lVar3 = lVar3 + 8;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

inline void 
Partition<T>::representativeLabeling(
    std::map<Index, Index>& out
) const {
    out.clear();	
    std::vector<Index> r(static_cast<std::size_t>(numberOfSets()));
    representatives(r.begin());
    for(Index j = 0; j < numberOfSets(); ++j) {
        out[r[static_cast<std::size_t>(j)]] = j;
    }
}